

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O0

CodePrinter * __thiscall choc::text::CodePrinter::operator<<(CodePrinter *this,unsigned_long v)

{
  string local_38;
  unsigned_long local_18;
  unsigned_long v_local;
  CodePrinter *this_local;
  
  local_18 = v;
  v_local = (unsigned_long)this;
  std::__cxx11::to_string(&local_38,v);
  append(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

CodePrinter& CodePrinter::operator<< (IntegerType v)
{
    static_assert (std::is_integral<IntegerType>::value, "You're probably trying to write a type that's not supported");
    append (std::to_string (v));
    return *this;
}